

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cc
# Opt level: O0

void __thiscall lf::base::Timer::Resume(Timer *this)

{
  bool bVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_28;
  cpu_times current;
  Timer *this_local;
  
  current.system.__r = (rep)this;
  bVar1 = IsStopped(this);
  if (bVar1) {
    current.user.__r = (this->times_).system.__r;
    dStack_28.__r = (this->times_).wall.__r;
    current.wall.__r = (this->times_).user.__r;
    Start(this);
    std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator-=
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)this,&dStack_28);
    std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator-=
              (&(this->times_).user,&current.wall);
    std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator-=
              (&(this->times_).system,&current.user);
  }
  return;
}

Assistant:

void Timer::Resume() noexcept {
  if (IsStopped()) {
    const cpu_times current(times_);
    Start();
    times_.wall -= current.wall;
    times_.user -= current.user;
    times_.system -= current.system;
  }
}